

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O3

void c4mat_print_some(int m,int n,complex<float> *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  int local_3c;
  int local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (0 < n && 0 < m) {
    iVar3 = i4_min(jhi,n);
    if (jlo <= iVar3) {
      local_38 = (jlo + -1) * m + -1;
      do {
        iVar3 = i4_min(jlo + 3,n);
        iVar4 = i4_min(iVar3,jhi);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Col: ",7);
        iVar3 = jlo;
        if (jlo <= iVar4) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     ",5);
            *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 10;
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"     ",5);
            bVar9 = iVar3 < iVar4;
            iVar3 = iVar3 + 1;
          } while (bVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Row\n",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ---\n",6);
        iVar3 = i4_max(ilo,1);
        iVar5 = i4_min(ihi,m);
        if (iVar3 <= iVar5) {
          local_3c = iVar3 + local_38;
          do {
            *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 5;
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
            if ((uint)(iVar4 - jlo) < 0x7fffffff) {
              lVar7 = 0;
              iVar8 = local_3c;
              do {
                fVar1 = *(float *)&a[iVar8]._M_value;
                fVar2 = *(float *)((long)&a[iVar8]._M_value + 4);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 8;
                poVar6 = std::ostream::_M_insert<double>((double)fVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
                *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
                std::ostream::_M_insert<double>((double)fVar2);
                lVar7 = lVar7 + 1;
                iVar8 = iVar8 + m;
              } while (lVar7 < (int)((iVar4 - jlo) + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            local_3c = local_3c + 1;
            bVar9 = iVar3 != iVar5;
            iVar3 = iVar3 + 1;
          } while (bVar9);
        }
        jlo = jlo + 4;
        iVar3 = i4_min(jhi,n);
        local_38 = local_38 + m * 4;
      } while (jlo <= iVar3);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  (None)\n",9);
  return;
}

Assistant:

void c4mat_print_some ( int m, int n, complex <float> a[], int ilo, int jlo, 
  int ihi, int jhi, string title )

//****************************************************************************80
//
//  Purpose:
//
//    C4MAT_PRINT_SOME prints some of a C4MAT.
//
//  Discussion:
//
//    A C4MAT is an array of complex <float> values.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    20 April 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, N, the number of rows and columns in the matrix.
//
//    Input, complex <float> A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
  complex <float> c;
  int i;
  int i2hi;
  int i2lo;
  int inc;
  int incx = 4;
  int j;
  int j2;
  int j2hi;
  int j2lo;

  cout << "\n";
  cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    cout << "\n";
    cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of INCX.
//
  for ( j2lo = jlo; j2lo <= i4_min ( jhi, n ); j2lo = j2lo + incx )
  {
    j2hi = j2lo + incx - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    inc = j2hi + 1 - j2lo;

    cout << "\n";
    cout << "  Col: ";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      j2 = j + 1 - j2lo;
      cout << "     " << setw(10) << j << "     ";
    }
    cout << "\n";
    cout << "  Row\n";
    cout << "  ---\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
      cout << setw(5) << i << ":";
//
//  Print out (up to) INCX entries in row I, that lie in the current strip.
//
      for ( j2 = 1; j2 <= inc; j2++ )
      {
        j = j2lo - 1 + j2;
        c = a[i-1+(j-1)*m];
        cout << "  " << setw(8) << real ( c )
             << "  " << setw(8) << imag ( c );
      }
      cout << "\n";
    }
  }

  return;
}